

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalGenerator::CreateGeneratorTargets(cmGlobalGenerator *this,TargetTypes targetTypes)

{
  pointer ppcVar1;
  cmTarget *t;
  cmLocalGenerator *lg;
  bool bVar2;
  cmGeneratorTarget *this_00;
  mapped_type *ppcVar3;
  pointer ppcVar4;
  pointer ppcVar5;
  pointer ppcVar6;
  ulong uVar7;
  ulong uVar8;
  cmGlobalGenerator *this_01;
  pointer ppcVar9;
  cmTarget *ownedImpTgt;
  map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
  importedMap;
  cmTarget *local_68;
  undefined1 local_60 [16];
  _Alloc_hider local_50;
  _Base_ptr local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_48 = (_Base_ptr)(local_60 + 8);
  local_60._8_4_ = _S_red;
  uVar7 = 0;
  local_50._M_p = (pointer)0x0;
  local_40._8_8_ = 0;
  ppcVar4 = (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppcVar6 = (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  this_01 = this;
  local_40._M_allocated_capacity = (size_type)local_48;
  if (ppcVar6 != ppcVar4) {
    do {
      ppcVar9 = (ppcVar4[uVar7]->ImportedTargetsOwned).
                super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppcVar1 = (ppcVar4[uVar7]->ImportedTargetsOwned).
                super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppcVar9 != ppcVar1) {
        do {
          t = *ppcVar9;
          lg = (this->LocalGenerators).
               super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar7];
          local_68 = t;
          this_00 = (cmGeneratorTarget *)operator_new(0x5a8);
          cmGeneratorTarget::cmGeneratorTarget(this_00,t,lg);
          cmLocalGenerator::AddOwnedImportedGeneratorTarget(lg,this_00);
          this_01 = (cmGlobalGenerator *)local_60;
          ppcVar3 = std::
                    map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
                    ::operator[]((map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
                                  *)this_01,&local_68);
          *ppcVar3 = this_00;
          ppcVar9 = ppcVar9 + 1;
        } while (ppcVar9 != ppcVar1);
        ppcVar4 = (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppcVar6 = (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (uVar7 < (ulong)((long)ppcVar6 - (long)ppcVar4 >> 3));
  }
  ppcVar5 = (this->LocalGenerators).
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->LocalGenerators).
      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppcVar5) {
    uVar7 = 0;
    uVar8 = 1;
    do {
      CreateGeneratorTargets
                (this_01,targetTypes,
                 (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar7],ppcVar5[uVar7],
                 (map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
                  *)local_60);
      ppcVar5 = (this->LocalGenerators).
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      bVar2 = uVar8 < (ulong)((long)(this->LocalGenerators).
                                    super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar5 >> 3)
      ;
      uVar7 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar2);
  }
  std::
  _Rb_tree<cmTarget_*,_std::pair<cmTarget_*const,_cmGeneratorTarget_*>,_std::_Select1st<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
  ::~_Rb_tree((_Rb_tree<cmTarget_*,_std::pair<cmTarget_*const,_cmGeneratorTarget_*>,_std::_Select1st<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
               *)local_60);
  return;
}

Assistant:

void cmGlobalGenerator::CreateGeneratorTargets(TargetTypes targetTypes)
{
  std::map<cmTarget*, cmGeneratorTarget*> importedMap;
  for (unsigned int i = 0; i < this->Makefiles.size(); ++i) {
    cmMakefile* mf = this->Makefiles[i];
    for (cmTarget* ownedImpTgt : mf->GetOwnedImportedTargets()) {
      cmLocalGenerator* lg = this->LocalGenerators[i];
      cmGeneratorTarget* gt = new cmGeneratorTarget(ownedImpTgt, lg);
      lg->AddOwnedImportedGeneratorTarget(gt);
      importedMap[ownedImpTgt] = gt;
    }
  }

  // Construct per-target generator information.
  for (unsigned int i = 0; i < this->LocalGenerators.size(); ++i) {
    this->CreateGeneratorTargets(targetTypes, this->Makefiles[i],
                                 this->LocalGenerators[i], importedMap);
  }
}